

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::GrowCapacity
          (ExtensionSet *this,size_t minimum_new_capacity)

{
  ushort uVar1;
  Arena *this_00;
  KeyValue *__src;
  KeyValue *__dest;
  ushort uVar2;
  ulong n;
  bool bVar3;
  
  if (this->flat_capacity_ < minimum_new_capacity && (ulong)this->flat_capacity_ < 0x101) {
    uVar2 = this->flat_capacity_;
    do {
      bVar3 = uVar2 == 0;
      uVar2 = uVar2 * 4;
      if (bVar3) {
        uVar2 = 1;
      }
    } while (uVar2 < minimum_new_capacity);
    this->flat_capacity_ = uVar2;
    if (0x100 < uVar2) {
      __assert_fail("!is_large()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.h"
                    ,0x331,"KeyValue *google::protobuf::internal::ExtensionSet::flat_begin()");
    }
    this_00 = this->arena_;
    __src = (this->map_).flat;
    uVar1 = this->flat_size_;
    n = (ulong)uVar2 << 5;
    if (this_00 == (Arena *)0x0) {
      __dest = (KeyValue *)operator_new__(n);
    }
    else {
      if (*(long *)(this_00 + 0x70) != 0) {
        Arena::OnArenaAllocation(this_00,(type_info *)&KeyValue::typeinfo,n);
      }
      __dest = (KeyValue *)Arena::AllocateAlignedNoHook(this_00,n);
    }
    (this->map_).flat = __dest;
    if (uVar1 != 0) {
      memmove(__dest,__src,(ulong)uVar1 << 5);
    }
    if (__src != (KeyValue *)0x0 && this->arena_ == (Arena *)0x0) {
      operator_delete__(__src);
      return;
    }
  }
  return;
}

Assistant:

void ExtensionSet::GrowCapacity(size_t minimum_new_capacity) {
  if (PROTOBUF_PREDICT_FALSE(is_large())) {
    return;  // LargeMap does not have a "reserve" method.
  }
  if (flat_capacity_ >= minimum_new_capacity) {
    return;
  }

  const auto old_flat_capacity = flat_capacity_;

  do {
    flat_capacity_ = flat_capacity_ == 0 ? 1 : flat_capacity_ * 4;
  } while (flat_capacity_ < minimum_new_capacity);

  const KeyValue* begin = flat_begin();
  const KeyValue* end = flat_end();
  if (flat_capacity_ > kMaximumFlatCapacity) {
    // Switch to LargeMap
    map_.large = Arena::Create<LargeMap>(arena_);
    LargeMap::iterator hint = map_.large->begin();
    for (const KeyValue* it = begin; it != end; ++it) {
      hint = map_.large->insert(hint, {it->first, it->second});
    }
    flat_size_ = 0;
  } else {
    map_.flat = Arena::CreateArray<KeyValue>(arena_, flat_capacity_);
    std::copy(begin, end, map_.flat);
  }
  if (arena_ == nullptr) {
    DeleteFlatMap(begin, old_flat_capacity);
  }
}